

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex.h
# Opt level: O0

void __thiscall
directed_flag_complex_t::for_each_cell<directed_flag_complex_computer::add_cell_index_to_cache_t>
          (directed_flag_complex_t *this,
          vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
          *fs,int min_dimension,int max_dimension)

{
  int thread_id;
  size_type sVar1;
  reference_wrapper<directed_flag_complex_computer::add_cell_index_to_cache_t> __args_3;
  int in_ECX;
  int in_EDX;
  vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
  *in_RSI;
  int *in_RDI;
  int i;
  int index;
  vector<std::thread,_std::allocator<std::thread>_> t;
  int number_of_threads;
  add_cell_index_to_cache_t *in_stack_ffffffffffffff48;
  thread *this_00;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  vector<std::thread,_std::allocator<std::thread>_> *this_01;
  int local_7c;
  int *__args_2;
  code *__args_1;
  directed_flag_complex_t **__args;
  type *in_stack_ffffffffffffffa8;
  int iVar2;
  undefined4 in_stack_ffffffffffffffb4;
  int *in_stack_ffffffffffffffc0;
  pointer in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  add_cell_index_to_cache_t *in_stack_ffffffffffffffd8;
  
  if (in_ECX == -1) {
    in_ECX = in_EDX;
  }
  sVar1 = std::
          vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
          ::size(in_RSI);
  thread_id = (int)sVar1;
  sVar1 = (size_type)thread_id;
  this_01 = (vector<std::thread,_std::allocator<std::thread>_> *)&stack0xffffffffffffffc7;
  std::allocator<std::thread>::allocator((allocator<std::thread> *)0x18ceaa);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            (this_01,sVar1,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  std::allocator<std::thread>::~allocator((allocator<std::thread> *)0x18cecd);
  for (iVar2 = 0; iVar2 < thread_id + -1; iVar2 = iVar2 + 1) {
    __args_1 = worker_thread<directed_flag_complex_computer::add_cell_index_to_cache_t>;
    __args = (directed_flag_complex_t **)0x0;
    __args_2 = in_RDI;
    std::
    vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
    ::operator[](in_RSI,(long)iVar2);
    __args_3 = std::ref<directed_flag_complex_computer::add_cell_index_to_cache_t>
                         (in_stack_ffffffffffffff48);
    this_00 = (thread *)&stack0xffffffffffffffe8;
    in_stack_ffffffffffffff48 = (add_cell_index_to_cache_t *)&stack0xffffffffffffffec;
    std::thread::
    thread<void(directed_flag_complex_t::*)(unsigned_long,int,directed_flag_complex_computer::add_cell_index_to_cache_t&,int,int),directed_flag_complex_t*,int&,int&,std::reference_wrapper<directed_flag_complex_computer::add_cell_index_to_cache_t>,int&,int&,void>
              ((thread *)CONCAT44(in_stack_ffffffffffffffb4,iVar2),in_stack_ffffffffffffffa8,__args,
               (int *)__args_1,__args_2,
               (reference_wrapper<directed_flag_complex_computer::add_cell_index_to_cache_t> *)
               __args_3._M_data,in_stack_ffffffffffffffc0,(int *)in_stack_ffffffffffffffc8);
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
              ((vector<std::thread,_std::allocator<std::thread>_> *)&stack0xffffffffffffffc8,
               (long)iVar2);
    std::thread::operator=(this_00,(thread *)in_stack_ffffffffffffff48);
    std::thread::~thread((thread *)0x18cf94);
  }
  iVar2 = thread_id + -1;
  std::
  vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
  ::operator[](in_RSI,(long)iVar2);
  worker_thread<directed_flag_complex_computer::add_cell_index_to_cache_t>
            ((directed_flag_complex_t *)in_RSI,CONCAT44(in_EDX,in_ECX),thread_id,
             in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  for (local_7c = 0; local_7c < thread_id + -1; local_7c = local_7c + 1) {
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
              ((vector<std::thread,_std::allocator<std::thread>_> *)&stack0xffffffffffffffc8,
               (long)local_7c);
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)
             CONCAT44(iVar2,in_stack_ffffffffffffff60));
  return;
}

Assistant:

void for_each_cell(std::vector<Func>& fs, int min_dimension, int max_dimension = -1) {
		if (max_dimension == -1) max_dimension = min_dimension;
		auto number_of_threads = int(fs.size());
		std::vector<std::thread> t(number_of_threads);

		for (int index = 0; index < number_of_threads - 1; ++index)
			t[index] = std::thread(&directed_flag_complex_t::worker_thread<Func>, this, number_of_threads, index,
			                       std::ref(fs[index]), min_dimension, max_dimension);

		// Also do work in this thread, namely the last bit
		worker_thread(number_of_threads, number_of_threads - 1, fs[number_of_threads - 1], min_dimension,
		              max_dimension);

		// Wait until all threads stopped
		for (int i = 0; i < number_of_threads - 1; ++i) t[i].join();
	}